

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.hpp
# Opt level: O0

ModuleHost<chains::accumulator::Module,_std::tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>,_chains::Expose<>_>
* __thiscall
chains::
module<chains::accumulator::Module,chains::Expose<>,chains::Value<chains::accumulator::Amount>,chains::Value<chains::accumulator::Wrap>>
          (ModuleHost<chains::accumulator::Module,_std::tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>,_chains::Expose<>_>
           *__return_storage_ptr__,chains *this,char *moduleName,
          Value<chains::accumulator::Amount> *values,Value<chains::accumulator::Wrap> *values_1)

{
  tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  local_78;
  undefined1 local_58 [23];
  tuple<chains::accumulator::Amount,_chains::accumulator::Wrap> local_41;
  undefined1 local_40 [8];
  tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  parameters;
  Value<chains::accumulator::Wrap> *values_local_1;
  Value<chains::accumulator::Amount> *values_local;
  char *moduleName_local;
  
  parameters.
  super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  .super__Head_base<0UL,_chains::Parameter<chains::accumulator::Amount>,_false>._M_head_impl.
  moduleName_ = (char *)values;
  std::tuple<chains::accumulator::Amount,_chains::accumulator::Wrap>::tuple<true,_true>(&local_41);
  local_58._8_8_ =
       parameters.
       super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
       .super__Head_base<0UL,_chains::Parameter<chains::accumulator::Amount>,_false>._M_head_impl.
       moduleName_;
  local_58._0_8_ = moduleName;
  boost::hana::transform_t::operator()
            ((tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
              *)local_40,(transform_t *)&boost::hana::transform,&local_41,
             (anon_class_16_2_0131cbe1 *)local_58);
  local_78.
  super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  .super__Tuple_impl<1UL,_chains::Parameter<chains::accumulator::Wrap>_>.
  super__Head_base<1UL,_chains::Parameter<chains::accumulator::Wrap>,_false>._M_head_impl.
  defaultValue_ = (double)local_40;
  local_78.
  super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  .super__Tuple_impl<1UL,_chains::Parameter<chains::accumulator::Wrap>_>.
  super__Head_base<1UL,_chains::Parameter<chains::accumulator::Wrap>,_false>._M_head_impl.
  moduleName_ = (char *)parameters.
                        super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
                        .super__Tuple_impl<1UL,_chains::Parameter<chains::accumulator::Wrap>_>.
                        super__Head_base<1UL,_chains::Parameter<chains::accumulator::Wrap>,_false>.
                        _M_head_impl.defaultValue_;
  local_78.
  super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  .super__Head_base<0UL,_chains::Parameter<chains::accumulator::Amount>,_false>._M_head_impl.
  defaultValue_ =
       (double)parameters.
               super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
               .super__Tuple_impl<1UL,_chains::Parameter<chains::accumulator::Wrap>_>.
               super__Head_base<1UL,_chains::Parameter<chains::accumulator::Wrap>,_false>.
               _M_head_impl.moduleName_;
  local_78.
  super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
  .super__Head_base<0UL,_chains::Parameter<chains::accumulator::Amount>,_false>._M_head_impl.
  moduleName_ = (char *)parameters.
                        super__Tuple_impl<0UL,_chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>
                        .
                        super__Head_base<0UL,_chains::Parameter<chains::accumulator::Amount>,_false>
                        ._M_head_impl.defaultValue_;
  ModuleHost<chains::accumulator::Module,_std::tuple<chains::Parameter<chains::accumulator::Amount>,_chains::Parameter<chains::accumulator::Wrap>_>,_chains::Expose<>_>
  ::ModuleHost(__return_storage_ptr__,(char *)this,&local_78);
  return __return_storage_ptr__;
}

Assistant:

auto module(const char* moduleName, const Values&... values)
{
  // Get the module's parameters, if specified
  using ModuleParameters = typename detail::ModuleParameters<ModuleTraits>::type;

  static_assert(valueParameterCheck<ModuleParameters, Values...>,
                "Value for parameter not found in module's parameter list");

  // Make a list of parameters from the module's parameter traits, applying any
  // user-specified values
  auto parameters =
    boost::hana::transform(ModuleParameters{}, [&values...](const auto& parameterTraits) {
      return detail::makeParameter(parameterTraits, values...);
    });

  return ModuleHost<ModuleTraits, decltype(parameters), Exposed>{moduleName, parameters};
}